

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytecodeJitX86.c
# Opt level: O1

void sysbvm_jit_jumpRelative(sysbvm_bytecodeJit_t *jit,size_t targetPC)

{
  sysbvm_bytecodeJitPCRelocation_t relocation_00;
  size_t sVar1;
  uint8_t instruction [5];
  sysbvm_bytecodeJitPCRelocation_t relocation;
  uint8_t local_30 [8];
  long local_28;
  size_t sStack_20;
  undefined8 local_18;
  
  local_30[4] = 0;
  local_30[0] = 0xe9;
  local_30[1] = '\0';
  local_30[2] = '\0';
  local_30[3] = '\0';
  sVar1 = sysbvm_bytecodeJit_addBytes(jit,5,local_30);
  local_28 = sVar1 - 4;
  local_18 = 0xfffffffffffffffc;
  relocation_00.targetPC = targetPC;
  relocation_00.offset = local_28;
  relocation_00.addend = -4;
  sStack_20 = targetPC;
  sysbvm_bytecodeJit_addPCRelocation(jit,relocation_00);
  return;
}

Assistant:

SYSBVM_API void sysbvm_jit_jumpRelative(sysbvm_bytecodeJit_t *jit, size_t targetPC)
{
    uint8_t instruction[] = {
        0xE9, 0x00, 0x00, 0x00, 0x00,
    };

    size_t relocationOffset = sysbvm_bytecodeJit_addBytes(jit, sizeof(instruction), instruction) - 4;
    sysbvm_bytecodeJitPCRelocation_t relocation = {
        .offset = relocationOffset,
        .targetPC = targetPC,
        .addend = -4,
    };
    sysbvm_bytecodeJit_addPCRelocation(jit, relocation);
}